

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Boolean MA_chop_stack(Integer memhandle)

{
  AD *in_RAX;
  Boolean BVar1;
  Integer handle;
  _AD *p_Var2;
  long lVar3;
  AD **ppAVar4;
  AD *data;
  int iVar5;
  AD *pAVar6;
  AD *ad;
  AD *local_38;
  
  ma_stats.calls[2] = ma_stats.calls[2] + 1;
  local_38 = in_RAX;
  BVar1 = mh2ad(memhandle,&local_38,BL_Stack,"MA_chop_stack");
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else {
    lVar3 = 0;
    if (ma_sused != (AD *)0x0) {
      iVar5 = 0;
      pAVar6 = (AD *)0x0;
      data = ma_sused;
      do {
        if (local_38 < data) {
          p_Var2 = data->next;
          pAVar6 = data;
        }
        else {
          handle = ma_table_lookup_assoc((TableData)data);
          if (handle == -1) {
            sprintf(ma_ebuf,"cannot find memhandle for block address 0x%lx",data);
            ma_error(EL_Nonfatal,ET_Internal,"mh_free",ma_ebuf);
          }
          else {
            ma_table_deallocate(handle);
          }
          ppAVar4 = &pAVar6->next;
          p_Var2 = data->next;
          if (pAVar6 == (AD *)0x0) {
            ppAVar4 = &ma_sused;
          }
          *ppAVar4 = p_Var2;
          iVar5 = iVar5 + 1;
        }
        data = p_Var2;
      } while (p_Var2 != (_AD *)0x0);
      lVar3 = (long)iVar5;
    }
    ma_stats.sblocks = ma_stats.sblocks - lVar3;
    ma_stats.sbytes =
         (long)ma_sp + (ma_stats.sbytes - (long)(local_38->name + (local_38->nbytes - 0x10)));
    BVar1 = 1;
    ma_sp = local_38->name + (local_38->nbytes - 0x10);
  }
  return BVar1;
}

Assistant:

public Boolean MA_chop_stack(Integer memhandle)/*the block to deallocate up to*/
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_chop_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Stack, "MA_chop_stack"))
        return MA_FALSE;

    /* delete block and all blocks above it from used list */
#ifdef STATS
    ma_stats.sblocks -=
        list_delete_many(&ma_sused, ad_le, (Pointer)ad, mh_free);
#else
    (void)list_delete_many(&ma_sused, ad_le, (Pointer)ad, mh_free);
#endif /* STATS */

    /* pop block and all blocks above it from stack */
#ifdef STATS
    ma_stats.sbytes -= (((Pointer)ad + ad->nbytes) - ma_sp);
#endif /* STATS */
    ma_sp = (Pointer)ad + ad->nbytes;

    /* success */
    return MA_TRUE;
}